

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::visitSwitch(CodeFolding *this,Switch *curr)

{
  ArenaVector<wasm::Name> *pAVar1;
  Name *pNVar2;
  undefined1 auStack_58 [8];
  Name target;
  Iterator __begin2;
  
  __begin2.parent = (ArenaVector<wasm::Name> *)0x0;
  pAVar1 = (ArenaVector<wasm::Name> *)
           (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  target.super_IString.str._M_str = (char *)&curr->targets;
  while ((__begin2.parent != pAVar1 ||
         ((ArenaVector<wasm::Name> *)target.super_IString.str._M_str != &curr->targets))) {
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)&target.super_IString.str._M_str);
    auStack_58 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    target.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)&this->unoptimizables,(Name *)auStack_58);
    __begin2.parent =
         (ArenaVector<wasm::Name> *)
         ((long)&((__begin2.parent)->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).
                 data + 1);
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->unoptimizables,&curr->default_);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    for (auto target : curr->targets) {
      unoptimizables.insert(target);
    }
    unoptimizables.insert(curr->default_);
  }